

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mythread.h
# Opt level: O0

int mythread_create(mythread *thread,_func_void_ptr_void_ptr *func,void *arg)

{
  int iVar1;
  undefined1 local_120 [4];
  int ret;
  sigset_t all;
  sigset_t old;
  void *arg_local;
  _func_void_ptr_void_ptr *func_local;
  mythread *thread_local;
  
  sigfillset((sigset_t *)local_120);
  mythread_sigmask(2,(sigset_t *)local_120,(sigset_t *)(all.__val + 0xf));
  iVar1 = pthread_create(thread,(pthread_attr_t *)0x0,(__start_routine *)func,arg);
  mythread_sigmask(2,(sigset_t *)(all.__val + 0xf),(sigset_t *)0x0);
  return iVar1;
}

Assistant:

static inline int
mythread_create(mythread *thread, void *(*func)(void *arg), void *arg)
{
	sigset_t old;
	sigset_t all;
	sigfillset(&all);

	mythread_sigmask(SIG_SETMASK, &all, &old);
	const int ret = pthread_create(thread, NULL, func, arg);
	mythread_sigmask(SIG_SETMASK, &old, NULL);

	return ret;
}